

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

object * rd_item(void)

{
  wchar_t wVar1;
  object *poVar2;
  artifact *paVar3;
  ego_item *peVar4;
  monster_race *pmVar5;
  _Bool *p_Var6;
  curse_data *pcVar7;
  quark_t qVar8;
  object_kind *poVar9;
  char *pcVar10;
  int16_t *ip;
  long lVar11;
  ulong uVar12;
  uint8_t tmp8u;
  uint16_t tmp16u;
  uint8_t effect;
  uint8_t ver;
  object *obj;
  char buf [128];
  byte local_b5;
  ushort local_b4;
  uint8_t local_b2 [2];
  object *local_b0;
  char local_a8 [136];
  
  poVar2 = object_new();
  local_b2[1] = 1;
  local_b0 = poVar2;
  rd_u16b(&local_b4);
  rd_byte(local_b2 + 1);
  if (local_b4 != 0xffff) {
    return (object *)0x0;
  }
  rd_u16b(&poVar2->oidx);
  rd_byte(&local_b5);
  (poVar2->grid).y = (uint)local_b5;
  rd_byte(&local_b5);
  (poVar2->grid).x = (uint)local_b5;
  rd_string(local_a8,0x80);
  if (local_a8[0] != '\0') {
    wVar1 = tval_find_idx(local_a8);
    poVar2->tval = (uint8_t)wVar1;
  }
  rd_string(local_a8,0x80);
  if (local_a8[0] != '\0') {
    wVar1 = lookup_sval((uint)poVar2->tval,local_a8);
    poVar2->sval = (uint8_t)wVar1;
  }
  rd_s16b(&poVar2->pval);
  rd_byte(&poVar2->number);
  rd_s16b(&poVar2->weight);
  rd_string(local_a8,0x80);
  if (local_a8[0] != '\0') {
    paVar3 = lookup_artifact_name(local_a8);
    poVar2->artifact = paVar3;
    if (paVar3 == (artifact *)0x0) {
      pcVar10 = "Couldn\'t find artifact %s!";
      goto LAB_00163144;
    }
  }
  rd_string(local_a8,0x80);
  if (local_a8[0] != '\0') {
    peVar4 = lookup_ego_item(local_a8,(uint)poVar2->tval,(uint)poVar2->sval);
    poVar2->ego = peVar4;
    if (peVar4 == (ego_item *)0x0) {
      pcVar10 = "Couldn\'t find ego item %s!";
LAB_00163144:
      pcVar10 = format(pcVar10,local_a8);
      note(pcVar10);
      return (object *)0x0;
    }
  }
  rd_byte(local_b2);
  rd_s16b(&poVar2->timeout);
  rd_s16b(&poVar2->to_h);
  rd_s16b(&poVar2->to_d);
  rd_s16b(&poVar2->to_a);
  rd_s16b(&poVar2->ac);
  rd_byte(&poVar2->dd);
  rd_byte(&poVar2->ds);
  rd_byte(&poVar2->origin);
  rd_byte(&poVar2->origin_depth);
  rd_string(local_a8,0x80);
  if (local_a8[0] != '\0') {
    pmVar5 = lookup_monster(local_a8);
    poVar2->origin_race = pmVar5;
  }
  rd_byte(&poVar2->notice);
  if (of_size != '\0') {
    uVar12 = 0;
    do {
      rd_byte(poVar2->flags + uVar12);
      uVar12 = uVar12 + 1;
    } while (uVar12 < of_size);
  }
  if (obj_mod_max != '\0') {
    ip = poVar2->modifiers;
    uVar12 = 0;
    do {
      rd_s16b(ip);
      uVar12 = uVar12 + 1;
      ip = ip + 1;
    } while (uVar12 < obj_mod_max);
  }
  rd_byte(&local_b5);
  if (local_b5 != 0) {
    p_Var6 = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
    poVar2->brands = p_Var6;
    if (brand_max != '\0') {
      uVar12 = 0;
      do {
        rd_byte(&local_b5);
        poVar2->brands[uVar12] = local_b5 != 0;
        uVar12 = uVar12 + 1;
      } while (uVar12 < brand_max);
    }
  }
  rd_byte(&local_b5);
  if (local_b5 != 0) {
    p_Var6 = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
    poVar2->slays = p_Var6;
    if (slay_max != '\0') {
      uVar12 = 0;
      do {
        rd_byte(&local_b5);
        poVar2->slays[uVar12] = local_b5 != 0;
        uVar12 = uVar12 + 1;
      } while (uVar12 < slay_max);
    }
  }
  rd_byte(&local_b5);
  if (local_b5 != 0) {
    pcVar7 = (curse_data *)mem_zalloc((ulong)z_info->curse_max << 3);
    poVar2->curses = pcVar7;
    if (curse_max != '\0') {
      uVar12 = 0;
      do {
        rd_byte(&local_b5);
        poVar2->curses[uVar12].power = (uint)local_b5;
        rd_u16b(&local_b4);
        poVar2->curses[uVar12].timeout = (uint)local_b4;
        uVar12 = uVar12 + 1;
      } while (uVar12 < curse_max);
    }
  }
  if (elem_max != '\0') {
    lVar11 = 0x72;
    uVar12 = 0;
    do {
      rd_s16b((int16_t *)(poVar2->flags + lVar11 + -0x4c));
      poVar2 = local_b0;
      rd_byte(local_b0->flags + lVar11 + -0x4a);
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 4;
    } while (uVar12 < elem_max);
  }
  rd_s16b(&poVar2->held_m_idx);
  poVar2 = local_b0;
  rd_s16b(&local_b0->mimicking_m_idx);
  rd_u16b(&local_b4);
  if ((ulong)local_b4 != 0) {
    poVar2->activation = activations + local_b4;
  }
  rd_u16b(&local_b4);
  (poVar2->time).base = (uint)local_b4;
  rd_u16b(&local_b4);
  (poVar2->time).dice = (uint)local_b4;
  rd_u16b(&local_b4);
  (poVar2->time).sides = (uint)local_b4;
  rd_string(local_a8,0x80);
  if (local_a8[0] != '\0') {
    qVar8 = quark_add(local_a8);
    poVar2->note = qVar8;
  }
  poVar9 = lookup_kind((uint)poVar2->tval,(uint)poVar2->sval);
  poVar2->kind = poVar9;
  if (poVar2->tval == '\0') {
    if (poVar9 == (object_kind *)0x0 || poVar2->sval == '\0') goto LAB_00163128;
  }
  else if (poVar9 == (object_kind *)0x0) {
LAB_00163128:
    object_delete((chunk *)0x0,(chunk *)0x0,&local_b0);
    return (object *)0x0;
  }
  if (local_b2[0] != '\0') {
    poVar2->effect = poVar9->effect;
  }
  return poVar2;
}

Assistant:

static struct object *rd_item(void)
{
	struct object *obj = object_new();

	uint8_t tmp8u;
	uint16_t tmp16u;
	uint8_t effect;
	size_t i;
	char buf[128];
	uint8_t ver = 1;

	rd_u16b(&tmp16u);
	rd_byte(&ver);
	if (tmp16u != 0xffff)
		return NULL;

	rd_u16b(&obj->oidx);

	/* Location */
	rd_byte(&tmp8u);
	obj->grid.y = tmp8u;
	rd_byte(&tmp8u);
	obj->grid.x = tmp8u;

	/* Type/Subtype */
	rd_string(buf, sizeof(buf));
	if (buf[0]) {
		obj->tval = tval_find_idx(buf);
	}
	rd_string(buf, sizeof(buf));
	if (buf[0]) {
		obj->sval = lookup_sval(obj->tval, buf);
	}
	rd_s16b(&obj->pval);

	rd_byte(&obj->number);
	rd_s16b(&obj->weight);

	rd_string(buf, sizeof(buf));
	if (buf[0]) {
		obj->artifact = lookup_artifact_name(buf);
		if (!obj->artifact) {
			note(format("Couldn't find artifact %s!", buf));
			return NULL;
		}
	}
	rd_string(buf, sizeof(buf));
	if (buf[0]) {
		obj->ego = lookup_ego_item(buf, obj->tval, obj->sval);
		if (!obj->ego) {
			note(format("Couldn't find ego item %s!", buf));
			return NULL;
		}
	}
	rd_byte(&effect);

	rd_s16b(&obj->timeout);

	rd_s16b(&obj->to_h);
	rd_s16b(&obj->to_d);
	rd_s16b(&obj->to_a);

	rd_s16b(&obj->ac);

	rd_byte(&obj->dd);
	rd_byte(&obj->ds);

	rd_byte(&obj->origin);
	rd_byte(&obj->origin_depth);
	rd_string(buf, sizeof(buf));
	if (buf[0]) {
		obj->origin_race = lookup_monster(buf);
	}
	rd_byte(&obj->notice);

	for (i = 0; i < of_size; i++)
		rd_byte(&obj->flags[i]);

	for (i = 0; i < obj_mod_max; i++) {
		rd_s16b(&obj->modifiers[i]);
	}

	/* Read brands */
	rd_byte(&tmp8u);
	if (tmp8u) {
		obj->brands = mem_zalloc(z_info->brand_max * sizeof(bool));
		for (i = 0; i < brand_max; i++) {
			rd_byte(&tmp8u);
			obj->brands[i] = tmp8u ? true : false;
		}
	}

	/* Read slays */
	rd_byte(&tmp8u);
	if (tmp8u) {
		obj->slays = mem_zalloc(z_info->slay_max * sizeof(bool));
		for (i = 0; i < slay_max; i++) {
			rd_byte(&tmp8u);
			obj->slays[i] = tmp8u ? true : false;
		}
	}

	/* Read curses */
	rd_byte(&tmp8u);
	if (tmp8u) {
		obj->curses = mem_zalloc(z_info->curse_max * sizeof(struct curse_data));
		for (i = 0; i < curse_max; i++) {
			rd_byte(&tmp8u);
			obj->curses[i].power = tmp8u;
			rd_u16b(&tmp16u);
			obj->curses[i].timeout = tmp16u;
		}
	}

	for (i = 0; i < elem_max; i++) {
		rd_s16b(&obj->el_info[i].res_level);
		rd_byte(&obj->el_info[i].flags);
	}

	/* Monster holding object */
	rd_s16b(&obj->held_m_idx);

	rd_s16b(&obj->mimicking_m_idx);

	/* Activation */
	rd_u16b(&tmp16u);
	if (tmp16u)
		obj->activation = &activations[tmp16u];
	rd_u16b(&tmp16u);
	obj->time.base = tmp16u;
	rd_u16b(&tmp16u);
	obj->time.dice = tmp16u;
	rd_u16b(&tmp16u);
	obj->time.sides = tmp16u;

	/* Save the inscription */
	rd_string(buf, sizeof(buf));
	if (buf[0]) obj->note = quark_add(buf);

	/* Lookup item kind */
	obj->kind = lookup_kind(obj->tval, obj->sval);

	/* Check we have a kind */
	if ((!obj->tval && !obj->sval) || !obj->kind) {
		object_delete(NULL, NULL, &obj);
		return NULL;
	}

	/* Set effect */
	if (effect)
		obj->effect = obj->kind->effect;

	/* Success */
	return obj;
}